

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_rest(connectdata *conn)

{
  CURLcode CVar1;
  ftp_conn *ftpc;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  if ((*(int *)((long)(conn->data->req).protop + 0x18) == 0) ||
     ((conn->proto).ftpc.file == (char *)0x0)) {
    ftp._4_4_ = ftp_state_prepare_transfer(conn);
  }
  else {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"REST %d",0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    _state(conn,FTP_REST);
    ftp._4_4_ = CURLE_OK;
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_rest(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer != FTPTRANSFER_BODY) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* Determine if server can respond to REST command and therefore
       whether it supports range */
    PPSENDF(&conn->proto.ftpc.pp, "REST %d", 0);

    state(conn, FTP_REST);
  }
  else
    result = ftp_state_prepare_transfer(conn);

  return result;
}